

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O3

wchar_t history_def_del(void *p,HistEventW *ev,wchar_t num)

{
  HistEventW *ev_00;
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  
  wVar1 = history_def_set(p,ev,num);
  wVar2 = L'\xffffffff';
  if (wVar1 == L'\0') {
    pwVar3 = wcsdup(*(wchar_t **)(*(long *)((long)p + 0x28) + 8));
    ev->str = pwVar3;
    ev_00 = *(HistEventW **)((long)p + 0x28);
    ev->num = ev_00->num;
    history_def_delete((history_t *)p,ev_00,(hentry_t *)CONCAT44(extraout_var,extraout_EDX));
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

static int
history_def_del(void *p, TYPE(HistEvent) *ev __attribute__((__unused__)),
    const int num)
{
	history_t *h = (history_t *) p;
	if (history_def_set(h, ev, num) != 0)
		return -1;
	ev->str = Strdup(h->cursor->ev.str);
	ev->num = h->cursor->ev.num;
	history_def_delete(h, ev, h->cursor);
	return 0;
}